

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_char> * __thiscall
cimg_library::CImgList<unsigned_char>::get_append
          (CImg<unsigned_char> *__return_storage_ptr__,CImgList<unsigned_char> *this,char axis,
          float align)

{
  uint uVar1;
  uint uVar2;
  CImg<unsigned_char> *pCVar3;
  CImg<unsigned_char> *pCVar4;
  char cVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  int l_2;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int l;
  uchar local_3c [4];
  CImg<unsigned_char> *local_38;
  
  pCVar3 = this->_data;
  uVar10 = this->_width;
  local_38 = __return_storage_ptr__;
  if (uVar10 == 0 || pCVar3 == (CImg<unsigned_char> *)0x0) {
    __return_storage_ptr__->_data = (uchar *)0x0;
    __return_storage_ptr__->_width = 0;
    __return_storage_ptr__->_height = 0;
    __return_storage_ptr__->_depth = 0;
    __return_storage_ptr__->_spectrum = 0;
    __return_storage_ptr__->_is_shared = false;
  }
  else if (uVar10 == 1) {
    CImg<unsigned_char>::operator+(__return_storage_ptr__,pCVar3);
  }
  else {
    __return_storage_ptr__->_data = (uchar *)0x0;
    __return_storage_ptr__->_width = 0;
    __return_storage_ptr__->_height = 0;
    __return_storage_ptr__->_depth = 0;
    __return_storage_ptr__->_spectrum = 0;
    __return_storage_ptr__->_is_shared = false;
    cVar5 = axis + ' ';
    if ((byte)(axis + 0xa5U) < 0xe6) {
      cVar5 = axis;
    }
    uVar6 = 0;
    if ((int)uVar10 < 1) {
      uVar10 = 0;
    }
    if (cVar5 == 'x') {
      uVar11 = 0;
      uVar8 = 0;
      uVar12 = 0;
      for (lVar9 = 0; (ulong)uVar10 * 0x20 != lVar9; lVar9 = lVar9 + 0x20) {
        if (*(long *)((long)&pCVar3->_data + lVar9) != 0) {
          uVar6 = uVar6 + *(int *)((long)&pCVar3->_width + lVar9);
          uVar1 = *(uint *)((long)&pCVar3->_height + lVar9);
          uVar2 = *(uint *)((long)&pCVar3->_depth + lVar9);
          if (uVar11 <= uVar1) {
            uVar11 = uVar1;
          }
          if (uVar8 <= uVar2) {
            uVar8 = uVar2;
          }
          uVar1 = *(uint *)((long)&pCVar3->_spectrum + lVar9);
          if (uVar12 <= uVar1) {
            uVar12 = uVar1;
          }
        }
      }
      local_3c[3] = 0;
      CImg<unsigned_char>::assign(__return_storage_ptr__,uVar6,uVar11,uVar8,uVar12,local_3c + 3);
      if (__return_storage_ptr__->_data != (uchar *)0x0) {
        lVar7 = 0;
        iVar13 = 0;
        for (lVar9 = 0; lVar9 < (int)this->_width; lVar9 = lVar9 + 1) {
          pCVar4 = this->_data;
          pCVar3 = (CImg<unsigned_char> *)((long)&pCVar4->_width + lVar7);
          if (*(long *)((long)&pCVar4->_data + lVar7) != 0) {
            CImg<unsigned_char>::draw_image
                      (local_38,iVar13,
                       (int)((float)(uVar11 - *(int *)((long)&pCVar4->_height + lVar7)) * align),
                       (int)((float)(uVar8 - *(int *)((long)&pCVar4->_depth + lVar7)) * align),
                       (int)((float)(uVar12 - *(int *)((long)&pCVar4->_spectrum + lVar7)) * align),
                       pCVar3,1.0);
          }
          iVar13 = iVar13 + pCVar3->_width;
          lVar7 = lVar7 + 0x20;
        }
      }
    }
    else {
      lVar9 = (ulong)uVar10 * 0x20;
      if (cVar5 == 'y') {
        uVar10 = 0;
        uVar8 = 0;
        uVar6 = 0;
        uVar11 = 0;
        for (lVar7 = 0; lVar9 != lVar7; lVar7 = lVar7 + 0x20) {
          if (*(long *)((long)&pCVar3->_data + lVar7) != 0) {
            uVar12 = *(uint *)((long)&pCVar3->_width + lVar7);
            if (uVar10 <= uVar12) {
              uVar10 = uVar12;
            }
            uVar12 = *(uint *)((long)&pCVar3->_depth + lVar7);
            uVar8 = uVar8 + *(int *)((long)&pCVar3->_height + lVar7);
            if (uVar6 <= uVar12) {
              uVar6 = uVar12;
            }
            uVar12 = *(uint *)((long)&pCVar3->_spectrum + lVar7);
            if (uVar11 <= uVar12) {
              uVar11 = uVar12;
            }
          }
        }
        local_3c[2] = 0;
        CImg<unsigned_char>::assign(__return_storage_ptr__,uVar10,uVar8,uVar6,uVar11,local_3c + 2);
        if (__return_storage_ptr__->_data != (uchar *)0x0) {
          lVar9 = 0;
          iVar13 = 0;
          for (lVar7 = 0; lVar7 < (int)this->_width; lVar7 = lVar7 + 1) {
            pCVar3 = this->_data;
            if (*(long *)((long)&pCVar3->_data + lVar9) != 0) {
              CImg<unsigned_char>::draw_image
                        (local_38,(int)((float)(uVar10 - *(int *)((long)&pCVar3->_width + lVar9)) *
                                       align),iVar13,
                         (int)((float)(uVar6 - *(int *)((long)&pCVar3->_depth + lVar9)) * align),
                         (int)((float)(uVar11 - *(int *)((long)&pCVar3->_spectrum + lVar9)) * align)
                         ,(CImg<unsigned_char> *)((long)&pCVar3->_width + lVar9),1.0);
            }
            iVar13 = iVar13 + *(int *)((long)&pCVar3->_height + lVar9);
            lVar9 = lVar9 + 0x20;
          }
        }
      }
      else if (cVar5 == 'z') {
        uVar10 = 0;
        uVar6 = 0;
        uVar8 = 0;
        uVar11 = 0;
        for (lVar7 = 0; lVar9 != lVar7; lVar7 = lVar7 + 0x20) {
          if (*(long *)((long)&pCVar3->_data + lVar7) != 0) {
            uVar12 = *(uint *)((long)&pCVar3->_width + lVar7);
            uVar1 = *(uint *)((long)&pCVar3->_height + lVar7);
            if (uVar10 <= uVar12) {
              uVar10 = uVar12;
            }
            if (uVar6 <= uVar1) {
              uVar6 = uVar1;
            }
            uVar8 = uVar8 + *(int *)((long)&pCVar3->_depth + lVar7);
            uVar12 = *(uint *)((long)&pCVar3->_spectrum + lVar7);
            if (uVar11 <= uVar12) {
              uVar11 = uVar12;
            }
          }
        }
        local_3c[1] = 0;
        CImg<unsigned_char>::assign(__return_storage_ptr__,uVar10,uVar6,uVar8,uVar11,local_3c + 1);
        if (__return_storage_ptr__->_data != (uchar *)0x0) {
          lVar9 = 0;
          iVar13 = 0;
          for (lVar7 = 0; lVar7 < (int)this->_width; lVar7 = lVar7 + 1) {
            pCVar3 = this->_data;
            if (*(long *)((long)&pCVar3->_data + lVar9) != 0) {
              CImg<unsigned_char>::draw_image
                        (local_38,(int)((float)(uVar10 - *(int *)((long)&pCVar3->_width + lVar9)) *
                                       align),
                         (int)((float)(uVar6 - *(int *)((long)&pCVar3->_height + lVar9)) * align),
                         iVar13,(int)((float)(uVar11 - *(int *)((long)&pCVar3->_spectrum + lVar9)) *
                                     align),(CImg<unsigned_char> *)((long)&pCVar3->_width + lVar9),
                         1.0);
            }
            iVar13 = iVar13 + *(int *)((long)&pCVar3->_depth + lVar9);
            lVar9 = lVar9 + 0x20;
          }
        }
      }
      else {
        uVar10 = 0;
        uVar6 = 0;
        uVar11 = 0;
        uVar8 = 0;
        for (lVar7 = 0; lVar9 != lVar7; lVar7 = lVar7 + 0x20) {
          if (*(long *)((long)&pCVar3->_data + lVar7) != 0) {
            uVar12 = *(uint *)((long)&pCVar3->_width + lVar7);
            uVar1 = *(uint *)((long)&pCVar3->_height + lVar7);
            if (uVar10 <= uVar12) {
              uVar10 = uVar12;
            }
            if (uVar6 <= uVar1) {
              uVar6 = uVar1;
            }
            uVar12 = *(uint *)((long)&pCVar3->_depth + lVar7);
            if (uVar11 <= uVar12) {
              uVar11 = uVar12;
            }
            uVar8 = uVar8 + *(int *)((long)&pCVar3->_spectrum + lVar7);
          }
        }
        local_3c[0] = '\0';
        CImg<unsigned_char>::assign(__return_storage_ptr__,uVar10,uVar6,uVar11,uVar8,local_3c);
        if (__return_storage_ptr__->_data != (uchar *)0x0) {
          lVar9 = 0;
          iVar13 = 0;
          for (lVar7 = 0; lVar7 < (int)this->_width; lVar7 = lVar7 + 1) {
            pCVar3 = this->_data;
            if (*(long *)((long)&pCVar3->_data + lVar9) != 0) {
              CImg<unsigned_char>::draw_image
                        (local_38,(int)((float)(uVar10 - *(int *)((long)&pCVar3->_width + lVar9)) *
                                       align),
                         (int)((float)(uVar6 - *(int *)((long)&pCVar3->_height + lVar9)) * align),
                         (int)((float)(uVar11 - *(int *)((long)&pCVar3->_depth + lVar9)) * align),
                         iVar13,(CImg<unsigned_char> *)((long)&pCVar3->_width + lVar9),1.0);
            }
            iVar13 = iVar13 + *(int *)((long)&pCVar3->_spectrum + lVar9);
            lVar9 = lVar9 + 0x20;
          }
        }
      }
    }
  }
  return local_38;
}

Assistant:

CImg<T> get_append(const char axis, const float align=0) const {
      if (is_empty()) return CImg<T>();
      if (_width==1) return +((*this)[0]);
      unsigned int dx = 0, dy = 0, dz = 0, dc = 0, pos = 0;
      CImg<T> res;
      switch (cimg::uncase(axis)) {
      case 'x' : { // Along the X-axis.
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          if (img) {
            dx+=img._width;
            dy = cimg::max(dy,img._height);
            dz = cimg::max(dz,img._depth);
            dc = cimg::max(dc,img._spectrum);
          }
        }
        res.assign(dx,dy,dz,dc,0);
        if (res) cimglist_for(*this,l) {
            const CImg<T>& img = (*this)[l];
            if (img) res.draw_image(pos,
                                    (int)(align*(dy - img._height)),
                                    (int)(align*(dz - img._depth)),
                                    (int)(align*(dc - img._spectrum)),
                                    img);
            pos+=img._width;
          }
      } break;
      case 'y' : { // Along the Y-axis.
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          if (img) {
            dx = cimg::max(dx,img._width);
            dy+=img._height;
            dz = cimg::max(dz,img._depth);
            dc = cimg::max(dc,img._spectrum);
          }
        }
        res.assign(dx,dy,dz,dc,0);
        if (res) cimglist_for(*this,l) {
            const CImg<T>& img = (*this)[l];
            if (img) res.draw_image((int)(align*(dx - img._width)),
                                    pos,
                                    (int)(align*(dz - img._depth)),
                                    (int)(align*(dc - img._spectrum)),
                                    img);
            pos+=img._height;
          }
      } break;
      case 'z' : { // Along the Z-axis.
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          if (img) {
            dx = cimg::max(dx,img._width);
            dy = cimg::max(dy,img._height);
            dz+=img._depth;
            dc = cimg::max(dc,img._spectrum);
          }
        }
        res.assign(dx,dy,dz,dc,0);
        if (res) cimglist_for(*this,l) {
            const CImg<T>& img = (*this)[l];
            if (img) res.draw_image((int)(align*(dx - img._width)),
                                    (int)(align*(dy - img._height)),
                                    pos,
                                    (int)(align*(dc - img._spectrum)),
                                    img);
            pos+=img._depth;
          }
      } break;
      default : { // Along the C-axis.
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          if (img) {
            dx = cimg::max(dx,img._width);
            dy = cimg::max(dy,img._height);
            dz = cimg::max(dz,img._depth);
            dc+=img._spectrum;
          }
        }
        res.assign(dx,dy,dz,dc,0);
        if (res) cimglist_for(*this,l) {
            const CImg<T>& img = (*this)[l];
            if (img) res.draw_image((int)(align*(dx - img._width)),
                                    (int)(align*(dy - img._height)),
                                    (int)(align*(dz - img._depth)),
                                    pos,
                                    img);
            pos+=img._spectrum;
          }
      }
      }
      return res;
    }